

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::core::
     constructSA_from_typeBstar<char*,bitmap::BitmapArray<long>::iterator,long,int>
               (char *T,iterator SA,long *bucket_A,long *bucket_B,long n,long m,int alphabetsize)

{
  bool bVar1;
  difference_type dVar2;
  long in_RCX;
  value_reference *pvVar3;
  pos_type in_RDX;
  BitmapArray<long> *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  int c2;
  int c1;
  int c0;
  long s;
  iterator t;
  iterator j;
  iterator i;
  ulong in_stack_fffffffffffffe38;
  value_reference *in_stack_fffffffffffffe40;
  value_reference *in_stack_fffffffffffffe48;
  iterator local_178;
  reference local_168;
  reference local_158;
  reference local_148;
  iterator local_138;
  iterator local_128;
  reference local_118;
  reference local_108;
  iterator local_f8;
  iterator local_e8;
  reference local_d8;
  reference local_c8;
  reference local_b8;
  reference local_a8;
  iterator local_98;
  iterator local_88;
  int local_74;
  int local_70;
  int local_6c;
  value_reference *local_68;
  iterator local_60;
  iterator local_50;
  iterator local_40;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  iterator local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDI;
  local_10.array_ = in_RSI;
  local_10.pos_ = in_RDX;
  bitmap::BitmapArray<long>::iterator::iterator(&local_40);
  bitmap::BitmapArray<long>::iterator::iterator(&local_50);
  local_60.array_ = local_10.array_;
  local_60.pos_ = local_10.pos_;
  if (0 < in_stack_00000008) {
    for (local_70 = in_stack_00000010 + -2; -1 < local_70; local_70 = local_70 + -1) {
      local_88 = bitmap::BitmapArray<long>::iterator::operator+
                           ((iterator *)in_stack_fffffffffffffe48,
                            (difference_type)in_stack_fffffffffffffe40);
      bitmap::BitmapArray<long>::iterator::operator=(&local_40,&local_88);
      local_98 = bitmap::BitmapArray<long>::iterator::operator+
                           ((iterator *)in_stack_fffffffffffffe48,
                            (difference_type)in_stack_fffffffffffffe40);
      bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_98);
      local_74 = -1;
      while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_40,&local_50), bVar1) {
        bitmap::BitmapArray<long>::iterator::operator--(&local_50);
        local_a8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x110ef9);
        local_68 = (value_reference *)
                   bitmap::BitmapArray::value_reference::operator_cast_to_long
                             ((value_reference *)0x110f16);
        if ((long)local_68 < 0) {
          local_108 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x111174);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        }
        else {
          local_68 = (value_reference *)((long)&local_68[-1].pos_ + 7);
          if ((-1 < (long)local_68) &&
             (local_6c = (int)*(char *)((long)&local_68->array_ + local_18), local_6c <= local_70))
          {
            local_b8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x110f95);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
            if ((0 < (long)local_68) && (local_6c < *(char *)((long)local_68 + local_18 + -1))) {
              local_68 = (value_reference *)((ulong)local_68 ^ 0xffffffffffffffff);
            }
            if (local_74 == local_6c) {
              bitmap::BitmapArray<long>::iterator::operator--(&local_60);
              local_c8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11102a);
              bitmap::BitmapArray<long>::value_reference::operator=
                        (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
            }
            else {
              if (-1 < local_74) {
                dVar2 = bitmap::BitmapArray<long>::iterator::operator-(&local_60,&local_10);
                *(difference_type *)(local_28 + (long)(local_70 * in_stack_00000010 + local_74) * 8)
                     = dVar2;
              }
              local_74 = local_6c;
              local_f8 = bitmap::BitmapArray<long>::iterator::operator+
                                   ((iterator *)in_stack_fffffffffffffe48,
                                    (difference_type)in_stack_fffffffffffffe40);
              local_e8 = bitmap::BitmapArray<long>::iterator::operator-
                                   ((iterator *)in_stack_fffffffffffffe48,
                                    (difference_type)in_stack_fffffffffffffe40);
              bitmap::BitmapArray<long>::iterator::operator=(&local_60,&local_e8);
              local_d8 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x111130);
              bitmap::BitmapArray<long>::value_reference::operator=
                        (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
            }
          }
        }
      }
    }
  }
  local_74 = (int)*(char *)(local_18 + local_30 + -1);
  local_128 = bitmap::BitmapArray<long>::iterator::operator+
                        ((iterator *)in_stack_fffffffffffffe48,
                         (difference_type)in_stack_fffffffffffffe40);
  bitmap::BitmapArray<long>::iterator::operator=(&local_60,&local_128);
  local_118 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x111232);
  bitmap::BitmapArray<long>::value_reference::operator=
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  bitmap::BitmapArray<long>::iterator::operator=(&local_40,&local_10);
  local_138 = bitmap::BitmapArray<long>::iterator::operator+
                        ((iterator *)in_stack_fffffffffffffe48,
                         (difference_type)in_stack_fffffffffffffe40);
  bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_138);
  while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_40,&local_50), bVar1) {
    local_148 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1112ce);
    local_68 = (value_reference *)
               bitmap::BitmapArray::value_reference::operator_cast_to_long
                         ((value_reference *)0x1112eb);
    if ((long)local_68 < 0) {
      in_stack_fffffffffffffe38 = (ulong)local_68 ^ 0xffffffffffffffff;
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1114ae);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      pvVar3 = local_68;
    }
    else {
      pvVar3 = (value_reference *)((long)&local_68[-1].pos_ + 7);
      if ((-1 < (long)pvVar3) &&
         (local_6c = (int)*(char *)((long)&pvVar3->array_ + local_18),
         *(char *)((long)&pvVar3->array_ + local_18 + 1) <= local_6c)) {
        if ((0 < (long)pvVar3) && (*(char *)((long)local_68 + local_18 + -2) < local_6c)) {
          pvVar3 = (value_reference *)((ulong)pvVar3 ^ 0xffffffffffffffff);
        }
        local_68 = pvVar3;
        if (local_6c == local_74) {
          in_stack_fffffffffffffe48 = local_68;
          bitmap::BitmapArray<long>::iterator::operator++(&local_60);
          local_158 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1113cb);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          pvVar3 = local_68;
        }
        else {
          dVar2 = bitmap::BitmapArray<long>::iterator::operator-(&local_60,&local_10);
          *(difference_type *)(local_20 + (long)local_74 * 8) = dVar2;
          local_74 = local_6c;
          in_stack_fffffffffffffe40 = local_68;
          local_178 = bitmap::BitmapArray<long>::iterator::operator+
                                ((iterator *)in_stack_fffffffffffffe48,(difference_type)local_68);
          bitmap::BitmapArray<long>::iterator::operator=(&local_60,&local_178);
          local_168 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x111474);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          pvVar3 = local_68;
        }
      }
    }
    local_68 = pvVar3;
    bitmap::BitmapArray<long>::iterator::operator++(&local_40);
  }
  return;
}

Assistant:

void constructSA_from_typeBstar(const StringIterator_type T, SAIterator_type SA,
                                pos_type *bucket_A, pos_type *bucket_B,
                                pos_type n, pos_type m,
                                alphabetsize_type alphabetsize) {
  SAIterator_type i, j, t = SA;
  pos_type s;
  alphabetsize_type c0, c1, c2;

  /** An implementation version of MSufSort3's second stage. **/

  if (0 < m) {
    /* Construct the sorted order of type B suffixes by using
     the sorted order of type B* suffixes. */
    for (c1 = alphabetsize - 2; 0 <= c1; --c1) {
      /* Scan the suffix array from right to left. */
      for (i = SA + BUCKET_BSTAR(c1, c1 + 1), j = SA + (BUCKET_A(c1 + 1)+ 1),
      c2 = -1;
      i < j;) {
        if(0 <= (s = *--j)) {
          if((0 <= --s) && ((c0 = T[s]) <= c1)) {
            *j = ~(s + 1);
            if((0 < s) && (T[s - 1] > c0)) {s = ~s;}
            if(c2 == c0) {*--t = s;}
            else {
              if(0 <= c2) {BUCKET_B(c2, c1) = t - SA;}
              *(t = SA + BUCKET_B(c2 = c0, c1) - 1) = s;
            }
          }
        } else {
          *j = ~s;
        }
      }
    }
  }

  /* Construct the suffix array by using
   the sorted order of type B suffixes. */
  *(t = SA + (BUCKET_A(c2 = T[n - 1])+ 1)) = n - 1;
  /* Scan the suffix array from left to right. */
  for (i = SA, j = SA + n; i < j; ++i) {
    if (0 <= (s = *i)) {
      if ((0 <= --s) && ((c0 = T[s]) >= T[s + 1])) {
        if ((0 < s) && (T[s - 1] < c0)) {
          s = ~s;
        }
        if (c0 == c2) {
          *++t = s;
        } else {
          BUCKET_A(c2)= t - SA;
          *(t = SA + (BUCKET_A(c2 = c0) + 1)) = s;
        }
      }
    } else {
      *i = ~s;
    }
  }
}